

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O3

void __thiscall
Parfait::Octree<Parfait::Facet>::insert
          (Octree<Parfait::Facet> *this,int voxel_index,int object_index)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pNVar4;
  pointer pFVar5;
  iterator __position;
  int *piVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  ulong uVar12;
  undefined8 uVar13;
  Facet *this_00;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> inside;
  int local_6c;
  Point<double> local_68;
  undefined8 uStack_50;
  Point<double> local_48;
  
  uVar16 = (ulong)voxel_index;
  pNVar4 = (this->voxels).
           super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->voxels).
                  super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 4) *
           0x6db6db6db6db6db7;
  uVar14 = uVar16;
  local_6c = object_index;
  if (uVar16 <= uVar12 && uVar12 - uVar16 != 0) {
    uVar14 = (ulong)object_index;
    pFVar5 = (this->objects).super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = ((long)(this->objects).
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pFVar5 >> 5) * -0x5555555555555555;
    if (uVar14 <= uVar12 && uVar12 - uVar14 != 0) {
      dVar1 = *(double *)((long)&pNVar4[uVar16].extent.hi.pos + 0x10);
      dVar2 = *(double *)((long)&pNVar4[uVar16].extent.lo.pos + 0x10);
      this_00 = pFVar5 + uVar14;
      local_68.pos._M_elems[2] = (dVar1 + dVar2) * 0.5;
      dVar7 = pNVar4[uVar16].extent.hi.pos._M_elems[0];
      dVar8 = *(double *)((long)&pNVar4[uVar16].extent.hi.pos + 8);
      dVar9 = pNVar4[uVar16].extent.lo.pos._M_elems[0];
      dVar10 = *(double *)((long)&pNVar4[uVar16].extent.lo.pos + 8);
      local_68.pos._M_elems[0] = (dVar7 + dVar9) * 0.5;
      local_68.pos._M_elems[1] = (dVar8 + dVar10) * 0.5;
      local_48.pos._M_elems[2] = (dVar1 - dVar2) * 0.5;
      local_48.pos._M_elems[0] = (dVar7 - dVar9) * 0.5;
      local_48.pos._M_elems[1] = (dVar8 - dVar10) * 0.5;
      bVar11 = Facet::triBoxOverlap(this_00,&local_68,&local_48,&this_00->points);
      if (bVar11) {
        pNVar4 = (this->voxels).
                 super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(this->voxels).
                        super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 4) *
                 0x6db6db6db6db6db7;
        uVar14 = uVar16;
        if (uVar12 < uVar16 || uVar12 - uVar16 == 0) goto LAB_0010b892;
        pNVar4[uVar16].filled = true;
        lVar17 = -0x1c;
        do {
          iVar3 = *(int *)((long)pNVar4[uVar16].children._M_elems + lVar17 + 0x1c);
          if (iVar3 != -0xb) break;
          bVar11 = lVar17 != 0;
          lVar17 = lVar17 + 4;
        } while (bVar11);
        if (iVar3 == -0xb) {
          __position._M_current =
               *(pointer *)
                ((long)&pNVar4[uVar16].inside_objects.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl + 8);
          if (__position._M_current ==
              *(pointer *)
               ((long)&pNVar4[uVar16].inside_objects.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&pNVar4[uVar16].inside_objects,__position,
                       &local_6c);
          }
          else {
            *__position._M_current = local_6c;
            *(int **)((long)&pNVar4[uVar16].inside_objects.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                 __position._M_current + 1;
          }
          bVar11 = atMaxDepth(this,voxel_index);
          if (!bVar11) {
            local_68.pos._M_elems[0] = 0.0;
            local_68.pos._M_elems[1] = 0.0;
            local_68.pos._M_elems[2] = 0.0;
            pNVar4 = (this->voxels).
                     super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = ((long)(this->voxels).
                            super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 4) *
                     0x6db6db6db6db6db7;
            if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar16);
            }
            std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::reserve
                      ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)&local_68,
                       (long)*(pointer *)
                              ((long)&pNVar4[uVar16].inside_objects.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                       *(long *)&pNVar4[uVar16].inside_objects.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2);
            pNVar4 = (this->voxels).
                     super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = ((long)(this->voxels).
                            super__Vector_base<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 4) *
                     0x6db6db6db6db6db7;
            if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar16);
            }
            piVar15 = *(int **)&pNVar4[uVar16].inside_objects.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar6 = *(pointer *)
                      ((long)&pNVar4[uVar16].inside_objects.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
            if (piVar15 != piVar6) {
              do {
                local_48.pos._M_elems[0] =
                     (double)((this->objects).
                              super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                              _M_impl.super__Vector_impl_data._M_start + *piVar15);
                if (local_68.pos._M_elems[1] == local_68.pos._M_elems[2]) {
                  std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>::
                  _M_realloc_insert<Parfait::Facet*>
                            ((vector<Parfait::Facet*,std::allocator<Parfait::Facet*>> *)&local_68,
                             (iterator)local_68.pos._M_elems[1],(Facet **)&local_48);
                }
                else {
                  *(double *)local_68.pos._M_elems[1] = local_48.pos._M_elems[0];
                  local_68.pos._M_elems[1] = (double)((long)local_68.pos._M_elems[1] + 8);
                }
                piVar15 = piVar15 + 1;
              } while (piVar15 != piVar6);
            }
            if ((this->should_split).super__Function_base._M_manager == (_Manager_type)0x0) {
              uVar13 = std::__throw_bad_function_call();
              if ((void *)local_68.pos._M_elems[0] != (void *)0x0) {
                operator_delete((void *)local_68.pos._M_elems[0],
                                (long)local_68.pos._M_elems[2] - (long)local_68.pos._M_elems[0]);
              }
              _Unwind_Resume(uVar13);
            }
            bVar11 = (*(this->should_split)._M_invoker)
                               ((_Any_data *)&this->should_split,
                                (vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)
                                &local_68);
            if (bVar11) {
              splitVoxel(this,voxel_index);
            }
            if ((void *)local_68.pos._M_elems[0] != (void *)0x0) {
              operator_delete((void *)local_68.pos._M_elems[0],
                              (long)local_68.pos._M_elems[2] - (long)local_68.pos._M_elems[0]);
            }
          }
        }
        else {
          local_68.pos._M_elems[2] = *(double *)(pNVar4[uVar16].children._M_elems + 4);
          uStack_50 = *(undefined8 *)(pNVar4[uVar16].children._M_elems + 6);
          local_68.pos._M_elems[0] = *(double *)pNVar4[uVar16].children._M_elems;
          local_68.pos._M_elems[1] = *(double *)(pNVar4[uVar16].children._M_elems + 2);
          lVar17 = 0;
          do {
            iVar3 = *(int *)((long)local_68.pos._M_elems + lVar17);
            if (iVar3 != -0xb) {
              insert(this,iVar3,local_6c);
            }
            lVar17 = lVar17 + 4;
          } while (lVar17 != 0x20);
        }
      }
      return;
    }
  }
LAB_0010b892:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
             uVar12);
}

Assistant:

inline void insert(int voxel_index, int object_index) {
          const auto extent = voxels.at(voxel_index).extent;
          if(objects.at(object_index).intersects(extent)) {
              voxels.at(voxel_index).filled = true;
              if(voxels.at(voxel_index).isLeaf()) {
                  voxels.at(voxel_index).inside_objects.push_back(object_index);
                  if(not atMaxDepth(voxel_index)) {
                      std::vector<T*> inside;
                      inside.reserve(voxels.at(voxel_index).inside_objects.size());
                      for(auto i : voxels.at(voxel_index).inside_objects){
                          inside.push_back(&objects[i]);
                      }
                      if(should_split(inside)) {
                          splitVoxel(voxel_index);
                      }
                  }
              }
              else {
                  auto children = voxels.at(voxel_index).children;
                  for (auto child : children) {
                      if(child != Node::EMPTY)
                          insert(child, object_index);
                  }
              }
          }
      }